

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hook_state.cpp
# Opt level: O1

bool __thiscall
HookStateStepOut::Start(HookStateStepOut *this,shared_ptr<Debugger> *debugger,lua_State *current)

{
  Debugger *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  int iVar1;
  
  this_00 = (debugger->super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this_01 = (debugger->super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  if (current != (lua_State *)0x0) {
    (this->super_StackLevelBasedState).super_HookState.currentStateL = current;
    iVar1 = Debugger::GetStackLevel(this_00,false);
    (this->super_StackLevelBasedState).newStackLevel = iVar1;
    (this->super_StackLevelBasedState).oriStackLevel = iVar1;
  }
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  if (current != (lua_State *)0x0) {
    Debugger::ExitDebugMode
              ((debugger->super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  }
  return current != (lua_State *)0x0;
}

Assistant:

bool HookStateStepOut::Start(std::shared_ptr<Debugger> debugger, lua_State* current)
{
	if (!StackLevelBasedState::Start(debugger, current))
		return false;
	debugger->ExitDebugMode();
	return true;
}